

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

RefractDataOut cert::refract_func(Vec3 *v,Vec3 *n,float ni_over_nt)

{
  RefractDataOut RVar1;
  float t;
  Vec3 *v1;
  double dVar2;
  Vec3 VVar3;
  undefined8 local_e0;
  float local_d8;
  Vec3 local_d0;
  Vec3 local_c0;
  Vec3 local_b0;
  Vec3 local_a0;
  Vec3 local_90;
  Vec3 local_80;
  Vec3 local_70;
  Vec3 local_60;
  float local_50;
  float local_4c;
  float discriminant;
  float dt;
  float local_40;
  undefined1 local_38 [8];
  Vec3 uv;
  float ni_over_nt_local;
  Vec3 *n_local;
  Vec3 *v_local;
  undefined4 uStack_10;
  float local_c;
  
  uv.y = ni_over_nt;
  unique0x100001b6 = n;
  VVar3 = normalize(v);
  _discriminant = VVar3._0_8_;
  local_38._0_4_ = discriminant;
  local_38._4_4_ = dt;
  local_40 = VVar3.z;
  uv.x = local_40;
  _discriminant = VVar3;
  local_4c = dot((Vec3 *)local_38,stack0xffffffffffffffd8);
  t = uv.y;
  local_50 = 1.0 - uv.y * uv.y * (-local_4c * local_4c + 1.0);
  if (local_50 <= 0.0) {
    v_local._0_4_ = (uint)v_local._1_3_ << 8;
    Vec3::Vec3((Vec3 *)((long)&v_local + 4));
  }
  else {
    v_local._0_4_ = CONCAT31(v_local._1_3_,1);
    VVar3 = operator*(stack0xffffffffffffffd8,local_4c);
    local_90.z = VVar3.z;
    local_80.z = local_90.z;
    local_90._0_8_ = VVar3._0_8_;
    local_80.x = local_90.x;
    local_80.y = local_90.y;
    local_90 = VVar3;
    VVar3 = operator-((Vec3 *)local_38,&local_80);
    local_a0.z = VVar3.z;
    local_a0._0_8_ = VVar3._0_8_;
    local_70._0_8_ = local_a0._0_8_;
    local_70.z = local_a0.z;
    VVar3 = operator*(t,&local_70);
    v1 = stack0xffffffffffffffd8;
    local_b0.z = VVar3.z;
    local_60.z = local_b0.z;
    local_b0._0_8_ = VVar3._0_8_;
    local_60.x = local_b0.x;
    local_60.y = local_b0.y;
    local_b0 = VVar3;
    dVar2 = sqrt((double)(ulong)(uint)local_50);
    VVar3 = operator*(v1,SUB84(dVar2,0));
    local_d0.z = VVar3.z;
    local_c0.z = local_d0.z;
    local_d0._0_8_ = VVar3._0_8_;
    local_c0.x = local_d0.x;
    local_c0.y = local_d0.y;
    VVar3 = operator-(&local_60,&local_c0);
    local_e0 = VVar3._0_8_;
    stack0xffffffffffffffec = local_e0;
    local_d8 = VVar3.z;
    local_c = local_d8;
  }
  RVar1.refracted.x = (float)v_local._4_4_;
  RVar1.refracted.y = (float)uStack_10;
  RVar1._0_4_ = (int)v_local;
  RVar1.refracted.z = local_c;
  return RVar1;
}

Assistant:

constexpr RefractDataOut refract_func (Vec3 const& v, Vec3 const& n, float ni_over_nt)
{
	Vec3 uv = normalize (v);
	float dt = dot (uv, n);
	float discriminant = 1.0 - ni_over_nt * ni_over_nt * (1 - dt * dt);
	if (discriminant > 0)
	{
		return { true, ni_over_nt * (uv - n * dt) - n * sqrt (discriminant) };
	}
	else
		return { false };
}